

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::MkdirCommand::getVerboseDescription
          (MkdirCommand *this,SmallVectorImpl<char> *result)

{
  string *psVar1;
  BuildNode *pBVar2;
  _Alloc_hider __s;
  size_t __n;
  StringRef Str;
  StringRef Str_00;
  void *pvVar3;
  raw_ostream *prVar4;
  raw_svector_ostream os;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&os,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&os,"mkdir -p ");
  pBVar2 = *(this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = &(pBVar2->super_Node).name;
  __s._M_p = (psVar1->_M_dataplus)._M_p;
  __n = (pBVar2->super_Node).name._M_string_length;
  Str.Data = (psVar1->_M_dataplus)._M_p;
  Str.Length = psVar1->_M_string_length;
  if (__n != 0) {
    pvVar3 = memchr(__s._M_p,0x20,__n);
    if ((long)pvVar3 - (long)__s._M_p != -1 && pvVar3 != (void *)0x0) {
      prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&os,'\"');
      pBVar2 = *(this->super_ExternalCommand).super_Command.outputs.
                super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Str_00.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
      Str_00.Length = (pBVar2->super_Node).name._M_string_length;
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_00);
      llvm::raw_ostream::operator<<(prVar4,'\"');
      goto LAB_0011953d;
    }
  }
  llvm::raw_ostream::operator<<((raw_ostream *)&os,Str);
LAB_0011953d:
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&os);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "mkdir -p ";
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(getOutputs()[0]->getName()).find(' ') != StringRef::npos) {
      os << '"' << getOutputs()[0]->getName() << '"';
    } else {
      os << getOutputs()[0]->getName();
    }
  }